

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O0

LY_ERR lyplg_type_compare_bits(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  void *__s1;
  void *__s2;
  int iVar1;
  size_t __n;
  lysc_type_bits *type_bits;
  lyd_value_bits *v2;
  lyd_value_bits *v1;
  lyd_value *val2_local;
  lyd_value *val1_local;
  ly_ctx *UNUSED_ctx_local;
  
  __s1 = (val1->field_2).dyn_mem;
  __s2 = (val2->field_2).dyn_mem;
  __n = lyplg_type_bits_bitmap_size((lysc_type_bits *)val1->realtype);
  iVar1 = memcmp(__s1,__s2,__n);
  if (iVar1 == 0) {
    UNUSED_ctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    UNUSED_ctx_local._4_4_ = LY_ENOT;
  }
  return UNUSED_ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_compare_bits(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    struct lyd_value_bits *v1, *v2;
    struct lysc_type_bits *type_bits = (struct lysc_type_bits *)val1->realtype;

    LYD_VALUE_GET(val1, v1);
    LYD_VALUE_GET(val2, v2);

    if (memcmp(v1->bitmap, v2->bitmap, lyplg_type_bits_bitmap_size(type_bits))) {
        return LY_ENOT;
    }
    return LY_SUCCESS;
}